

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

int64_t __thiscall fasttext::Args::getAutotuneModelSize(Args *this)

{
  initializer_list<std::pair<const_char,_int>_> __l;
  ulong uVar1;
  undefined1 *puVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  long lVar5;
  invalid_argument *this_00;
  allocator_type *in_RDI;
  invalid_argument *anon_var_0;
  bool parseError;
  size_t nonNumericCharacter;
  uint64_t size;
  char lastCharacter;
  uint64_t multiplier;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  units;
  string modelSize;
  size_t *__idx;
  string *in_stack_fffffffffffffe70;
  key_equal *in_stack_fffffffffffffe78;
  hasher *in_stack_fffffffffffffe80;
  long lVar6;
  size_type in_stack_fffffffffffffe88;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *in_stack_fffffffffffffe90;
  string *psVar7;
  iterator in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 uVar8;
  string local_140 [47];
  byte local_111;
  long local_110;
  long local_108;
  string local_100 [39];
  undefined1 local_d9;
  long local_d8;
  undefined1 local_bb [3];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 local_78;
  undefined4 local_34;
  string local_30 [40];
  long local_8;
  
  std::__cxx11::string::string(local_30,(string *)(in_RDI + 0x180));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uStack_98 = 0x3b9aca0000000067;
    uStack_90 = 0x3b9aca0000000047;
    local_b8 = 0x3e80000006b;
    uStack_b0 = 0x3e80000004b;
    local_a8 = 0xf42400000006d;
    uStack_a0 = 0xf42400000004d;
    local_80 = &local_b8;
    local_78 = 6;
    __idx = (size_t *)local_bb;
    std::allocator<std::pair<const_char,_int>_>::allocator
              ((allocator<std::pair<const_char,_int>_> *)0x188602);
    __l._M_len = in_stack_fffffffffffffea0;
    __l._M_array = in_stack_fffffffffffffe98;
    std::
    unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::unordered_map(in_stack_fffffffffffffe90,__l,in_stack_fffffffffffffe88,
                    in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_RDI);
    std::allocator<std::pair<const_char,_int>_>::~allocator
              ((allocator<std::pair<const_char,_int>_> *)0x18864d);
    local_d8 = 1;
    puVar2 = (undefined1 *)std::__cxx11::string::back();
    local_d9 = *puVar2;
    sVar3 = std::
            unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::count((unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                     *)in_stack_fffffffffffffe70,(key_type *)__idx);
    if (sVar3 != 0) {
      pmVar4 = std::
               unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
               ::operator[]((unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                             *)in_stack_fffffffffffffe70,(key_type *)__idx);
      local_d8 = (long)*pmVar4;
      psVar7 = local_30;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_100,(ulong)psVar7);
      std::__cxx11::string::operator=(local_30,local_100);
      std::__cxx11::string::~string(local_100);
    }
    local_108 = 0;
    local_110 = 0;
    local_111 = 0;
    local_108 = std::__cxx11::stol(in_stack_fffffffffffffe70,__idx,0);
    if ((local_111 & 1) == 0) {
      lVar6 = local_110;
      lVar5 = std::__cxx11::string::size();
      if (lVar6 != lVar5) {
        local_111 = 1;
      }
    }
    if ((local_111 & 1) != 0) {
      uVar8 = 1;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((char *)CONCAT17(uVar8,in_stack_fffffffffffffeb8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::invalid_argument::invalid_argument(this_00,local_140);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_8 = local_108 * local_d8;
    local_34 = 1;
    std::
    unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::~unordered_map((unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)0x18891b);
  }
  else {
    local_8 = -1;
    local_34 = 1;
  }
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

int64_t Args::getAutotuneModelSize() const {
  std::string modelSize = autotuneModelSize;
  if (modelSize.empty()) {
    return Args::kUnlimitedModelSize;
  }
  std::unordered_map<char, int> units = {
      {'k', 1000},
      {'K', 1000},
      {'m', 1000000},
      {'M', 1000000},
      {'g', 1000000000},
      {'G', 1000000000},
  };
  uint64_t multiplier = 1;
  char lastCharacter = modelSize.back();
  if (units.count(lastCharacter)) {
    multiplier = units[lastCharacter];
    modelSize = modelSize.substr(0, modelSize.size() - 1);
  }
  uint64_t size = 0;
  size_t nonNumericCharacter = 0;
  bool parseError = false;
  try {
    size = std::stol(modelSize, &nonNumericCharacter);
  } catch (std::invalid_argument&) {
    parseError = true;
  }
  if (!parseError && nonNumericCharacter != modelSize.size()) {
    parseError = true;
  }
  if (parseError) {
    throw std::invalid_argument(
        "Unable to parse model size " + autotuneModelSize);
  }

  return size * multiplier;
}